

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O3

string * __thiscall
PrintMenu::findMyType_abi_cxx11_(string *__return_storage_ptr__,PrintMenu *this,DishType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (type == SPC) {
    pcVar2 = "SPC";
    pcVar1 = "";
  }
  else if (type == BVG) {
    pcVar2 = "BVG";
    pcVar1 = "";
  }
  else if (type == ALC) {
    pcVar2 = "ALC";
    pcVar1 = "";
  }
  else {
    pcVar2 = "VEG";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintMenu::findMyType(DishType type)
{
    if (type == ALC)
        return "ALC";
    if(type == BVG)
        return "BVG";
    if (type == SPC)
        return "SPC";
    return "VEG";
}